

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>::
disposeImpl(HeapDisposer<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>
            *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::~ExceptionOr
              ((ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)
               ((long)pointer + 8));
    ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase((ImmediatePromiseNodeBase *)pointer);
  }
  operator_delete(pointer,0x188);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }